

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O0

void __thiscall QSslKey::QSslKey(QSslKey *this,HANDLE handle,KeyType type)

{
  QExplicitlySharedDataPointer<QSslKeyPrivate> *this_00;
  pointer pTVar1;
  uint in_EDX;
  undefined8 in_RSI;
  QSslKeyPrivate *in_RDI;
  TlsKey *tlsKey;
  QSslKeyPrivate *in_stack_ffffffffffffffc8;
  
  this_00 = (QExplicitlySharedDataPointer<QSslKeyPrivate> *)operator_new(0x10);
  QSslKeyPrivate::QSslKeyPrivate(in_RDI);
  QExplicitlySharedDataPointer<QSslKeyPrivate>::QExplicitlySharedDataPointer
            (this_00,in_stack_ffffffffffffffc8);
  QExplicitlySharedDataPointer<QSslKeyPrivate>::operator->
            ((QExplicitlySharedDataPointer<QSslKeyPrivate> *)0x39e2f0);
  pTVar1 = std::unique_ptr<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>::get
                     ((unique_ptr<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_> *)
                      0x39e2f8);
  if (pTVar1 != (pointer)0x0) {
    (*pTVar1->_vptr_TlsKey[7])(pTVar1,in_RSI,(ulong)in_EDX);
  }
  return;
}

Assistant:

QSslKey::QSslKey(Qt::HANDLE handle, QSsl::KeyType type)
    : d(new QSslKeyPrivate)
{
    if (auto *tlsKey = d->backend.get())
        tlsKey->fromHandle(handle, type);
}